

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_error_params.cc
# Opt level: O0

unique_ptr<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_> __thiscall
bssl::CreateCertErrorParams1SizeT(bssl *this,char *name,size_t value)

{
  unique_ptr<bssl::(anonymous_namespace)::CertErrorParams1SizeT,_std::default_delete<bssl::(anonymous_namespace)::CertErrorParams1SizeT>_>
  local_28;
  size_t local_20;
  size_t value_local;
  char *name_local;
  
  local_20 = value;
  value_local = (size_t)name;
  name_local = (char *)this;
  if (name == (char *)0x0) {
    abort();
  }
  ::std::make_unique<bssl::(anonymous_namespace)::CertErrorParams1SizeT,char_const*&,unsigned_long&>
            ((char **)&local_28,&value_local);
  ::std::unique_ptr<bssl::CertErrorParams,std::default_delete<bssl::CertErrorParams>>::
  unique_ptr<bssl::(anonymous_namespace)::CertErrorParams1SizeT,std::default_delete<bssl::(anonymous_namespace)::CertErrorParams1SizeT>,void>
            ((unique_ptr<bssl::CertErrorParams,std::default_delete<bssl::CertErrorParams>> *)this,
             &local_28);
  ::std::
  unique_ptr<bssl::(anonymous_namespace)::CertErrorParams1SizeT,_std::default_delete<bssl::(anonymous_namespace)::CertErrorParams1SizeT>_>
  ::~unique_ptr(&local_28);
  return (__uniq_ptr_data<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>,_true,_true>
          )(__uniq_ptr_data<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<CertErrorParams> CreateCertErrorParams1SizeT(const char *name,
                                                             size_t value) {
  BSSL_CHECK(name);
  return std::make_unique<CertErrorParams1SizeT>(name, value);
}